

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glew.c
# Opt level: O3

GLboolean glxewGetExtension(char *name)

{
  uint uVar1;
  GLboolean GVar2;
  Display *pDVar3;
  GLubyte *start;
  GLuint i;
  uint uVar4;
  
  if (__glewXGetCurrentDisplay != (PFNGLXGETCURRENTDISPLAYPROC)0x0) {
    pDVar3 = (*__glewXGetCurrentDisplay)();
    start = (GLubyte *)glXGetClientString(pDVar3,3);
    if (start != (GLubyte *)0x0) {
      uVar1 = 0;
      do {
        uVar4 = uVar1;
        uVar1 = uVar4 + 1;
      } while (start[uVar4] != '\0');
      GVar2 = _glewSearchExtension(name,start,start + uVar4);
      return GVar2;
    }
  }
  return '\0';
}

Assistant:

GLboolean glxewGetExtension (const char* name)
{    
  const GLubyte* start;
  const GLubyte* end;

  if (glXGetCurrentDisplay == NULL) return GL_FALSE;
  start = (const GLubyte*)glXGetClientString(glXGetCurrentDisplay(), GLX_EXTENSIONS);
  if (0 == start) return GL_FALSE;
  end = start + _glewStrLen(start);
  return _glewSearchExtension(name, start, end);
}